

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

stbi_us * stbi_load_16_from_callbacks
                    (stbi_io_callbacks *clbk,void *user,int *x,int *y,int *channels_in_file,
                    int desired_channels)

{
  stbi__uint16 *psVar1;
  undefined1 local_118 [8];
  stbi__context s;
  int desired_channels_local;
  int *channels_in_file_local;
  int *y_local;
  int *x_local;
  void *user_local;
  stbi_io_callbacks *clbk_local;
  
  s.img_buffer_original_end._4_4_ = desired_channels;
  stbi__start_callbacks((stbi__context *)local_118,clbk,user);
  psVar1 = stbi__load_and_postprocess_16bit
                     ((stbi__context *)local_118,x,y,channels_in_file,
                      s.img_buffer_original_end._4_4_);
  return psVar1;
}

Assistant:

STBIDEF stbi_us *stbi_load_16_from_callbacks(stbi_io_callbacks const *clbk, void *user, int *x, int *y, int *channels_in_file, int desired_channels)
{
   stbi__context s;
   stbi__start_callbacks(&s, (stbi_io_callbacks *)clbk, user);
   return stbi__load_and_postprocess_16bit(&s,x,y,channels_in_file,desired_channels);
}